

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::Section(Section *this,SectionInfo *info)

{
  SectionInfo *pSVar1;
  byte bVar2;
  int iVar3;
  IResultCapture *pIVar4;
  SectionInfo *in_RDI;
  undefined7 in_stack_ffffffffffffffb0;
  SectionInfo *in_stack_ffffffffffffffc8;
  
  NonCopyable::NonCopyable((NonCopyable *)in_RDI);
  *(undefined ***)&in_RDI->name = &PTR__Section_0023d038;
  SectionInfo::SectionInfo(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string((string *)&in_RDI[1].name._M_string_length);
  Counts::Counts((Counts *)&in_RDI[1].description._M_string_length);
  pSVar1 = in_RDI + 1;
  pIVar4 = getResultCapture();
  iVar3 = (*pIVar4->_vptr_IResultCapture[2])
                    (pIVar4,&(in_RDI->name)._M_string_length,&in_RDI[1].description._M_string_length
                    );
  bVar2 = (byte)iVar3;
  *(byte *)&(pSVar1->lineInfo).file = bVar2 & 1;
  Timer::Timer((Timer *)&in_RDI[1].lineInfo.line);
  Timer::start((Timer *)CONCAT17(bVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

Section::Section( SectionInfo const& info )
    :   m_info( info ),
        m_sectionIncluded( getResultCapture().sectionStarted( m_info, m_assertions ) )
    {
        m_timer.start();
    }